

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

double __thiscall pstore::logger::log(logger *this,double __x)

{
  char *in_RDX;
  uint in_ESI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar1;
  allocator local_39;
  long *local_38 [2];
  long local_28 [2];
  
  std::__cxx11::string::string((string *)local_38,in_RDX,&local_39);
  (*this->_vptr_logger[2])(this,(ulong)in_ESI,(string *)local_38);
  dVar1 = extraout_XMM0_Qa;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
    dVar1 = extraout_XMM0_Qa_00;
  }
  return dVar1;
}

Assistant:

void logger::log (priority const p, gsl::czstring const message) {
            this->log (p, std::string{message});
        }